

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
* fmt::v5::internal::vformat<fmt::v5::char8_t>
            (basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
             *__return_storage_ptr__,basic_string_view<fmt::v5::char8_t> format_str,
            basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
            args)

{
  basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_> *buf;
  basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_> buffer;
  basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_> local_220;
  
  local_220.super_basic_buffer<fmt::v5::char8_t>.ptr_ = local_220.store_;
  local_220.super_basic_buffer<fmt::v5::char8_t>.size_ = 0;
  local_220.super_basic_buffer<fmt::v5::char8_t>._vptr_basic_buffer =
       (_func_int **)&PTR_grow_00265120;
  local_220.super_basic_buffer<fmt::v5::char8_t>.capacity_ = 500;
  vformat_to<fmt::v5::char8_t>(&local_220.super_basic_buffer<fmt::v5::char8_t>,format_str,args);
  to_string<fmt::v5::char8_t,500ul>(__return_storage_ptr__,(v5 *)&local_220,buf);
  basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_>::
  ~basic_memory_buffer(&local_220);
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<Char> internal::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  return fmt::to_string(buffer);
}